

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O2

fdb_status wal_discard(filemgr *file,fdb_txn *txn)

{
  uint32_t uVar1;
  list_elem *plVar2;
  ulong uVar3;
  ulong uVar4;
  long decrement;
  list_elem *e;
  
  decrement = 0;
  e = txn->items->head;
  while (e != (list_elem *)0x0) {
    uVar1 = get_checksum((uint8_t *)e[-4].prev[1].next,(ulong)*(ushort *)&e[-4].prev[2].prev);
    uVar3 = (ulong)uVar1 % file->wal->num_shards;
    pthread_spin_lock(&file->wal->key_shards[uVar3].lock);
    if (file->config->seqtree_opt == '\x01') {
      uVar4 = (ulong)e[-1].prev % file->wal->num_shards;
      pthread_spin_lock(&file->wal->seq_shards[uVar4].lock);
      avl_remove(&file->wal->seq_shards[uVar4]._map,(avl_node *)&e[-6].next);
      pthread_spin_unlock(&file->wal->seq_shards[uVar4].lock);
    }
    list_remove((list *)&e[-4].prev[2].next,(list_elem *)&e[-7].next);
    if (((avl_node *)e[-4].prev)[1].right == (avl_node *)0x0) {
      avl_remove(&file->wal->key_shards[uVar3]._map,(avl_node *)e[-4].prev);
      decrement = decrement + (ulong)*(ushort *)&e[-4].prev[2].prev + 0x38;
      free(e[-4].prev[1].next);
      free(e[-4].prev);
    }
    plVar2 = list_remove(txn->items,e);
    if ((e[-3].prev == (list_elem *)(file->global_txn).txn_id) || (((ulong)e[-2].prev & 0x100) != 0)
       ) {
      atomic_decr_uint32_t(&file->wal->num_flushable,memory_order_seq_cst);
    }
    if (*(char *)&e[-2].prev != '\x02') {
      atomic_sub_uint64_t(&file->wal->datasize,(ulong)*(uint *)((long)&e[-2].prev + 4),
                          memory_order_relaxed);
      filemgr_mark_stale(file,(bid_t)e[-2].next,(ulong)*(uint *)((long)&e[-2].prev + 4));
    }
    free(&e[-7].next);
    atomic_decr_uint32_t(&file->wal->size,memory_order_seq_cst);
    decrement = decrement + 0x80;
    pthread_spin_unlock(&file->wal->key_shards[uVar3].lock);
    e = plVar2;
  }
  atomic_sub_uint64_t(&file->wal->mem_overhead,decrement,memory_order_relaxed);
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_discard(struct filemgr *file, fdb_txn *txn)
{
    struct wal_item *item;
    struct list_elem *e;
    size_t shard_num, seq_shard_num;
    uint64_t mem_overhead = 0;

    e = list_begin(txn->items);
    while(e) {
        item = _get_entry(e, struct wal_item, list_elem_txn);
        shard_num = get_checksum((uint8_t*)item->header->key,
                                 item->header->keylen) %
                                 file->wal->num_shards;
        spin_lock(&file->wal->key_shards[shard_num].lock);

        if (file->config->seqtree_opt == FDB_SEQTREE_USE) {
            // remove from seq map
            seq_shard_num = item->seqnum % file->wal->num_shards;
            spin_lock(&file->wal->seq_shards[seq_shard_num].lock);
            avl_remove(&file->wal->seq_shards[seq_shard_num]._map,
                       &item->avl_seq);
            spin_unlock(&file->wal->seq_shards[seq_shard_num].lock);
        }

        // remove from header's list
        list_remove(&item->header->items, &item->list_elem);
        // remove header if empty
        if (list_begin(&item->header->items) == NULL) {
            //remove from key map
            avl_remove(&file->wal->key_shards[shard_num]._map,
                       &item->header->avl_key);
            mem_overhead += sizeof(struct wal_item_header) + item->header->keylen;
            // free key and header
            free(item->header->key);
            free(item->header);
        }
        // remove from txn's list
        e = list_remove(txn->items, e);
        if (item->txn_id == file->global_txn.txn_id ||
            item->flag & WAL_ITEM_COMMITTED) {
            atomic_decr_uint32_t(&file->wal->num_flushable);
        }
        if (item->action != WAL_ACT_REMOVE) {
            atomic_sub_uint64_t(&file->wal->datasize, item->doc_size,
                                std::memory_order_relaxed);
            // mark as stale if the item is not an immediate remove
            filemgr_mark_stale(file, item->offset, item->doc_size);
        }

        // free
        free(item);
        atomic_decr_uint32_t(&file->wal->size);
        mem_overhead += sizeof(struct wal_item);
        spin_unlock(&file->wal->key_shards[shard_num].lock);
    }
    atomic_sub_uint64_t(&file->wal->mem_overhead, mem_overhead,
                        std::memory_order_relaxed);

    return FDB_RESULT_SUCCESS;
}